

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

void temp_allocate_frame(TCGContext_conflict9 *s,TCGTemp *ts)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  ulong uVar3;
  ulong uVar4;
  uint r;
  uint rm;
  int opc;
  uint uVar5;
  intptr_t in_R8;
  int in_R9D;
  
  uVar3 = s->current_frame_offset + 7U & 0xfffffffffffffff8;
  s->current_frame_offset = uVar3;
  uVar4 = uVar3 + 8;
  if ((long)uVar4 <= s->frame_end) {
    ts->mem_offset = uVar3;
    ts->mem_base = s->frame_temp;
    ts->field_0x4 = ts->field_0x4 | 0x10;
    s->current_frame_offset = s->current_frame_offset + 8;
    return;
  }
  temp_allocate_frame_cold_1();
  if (4 < (uint)ts) {
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x486,(char *)0x0);
  }
  rm = (uint)uVar4;
  switch((ulong)ts & 0xffffffff) {
  case 0:
    uVar3 = 0;
    if (0 < (int)rm) {
      uVar3 = uVar4 & 0xffffffff;
    }
    uVar5 = (uint)uVar3;
    if (r < 0x10) {
      uVar5 = (uint)(uVar3 >> 3) & 1 | r >> 1 & 4;
      if (uVar5 != 0) {
        pbVar1 = s->code_ptr;
        s->code_ptr = pbVar1 + 1;
        *pbVar1 = (byte)uVar5 | 0x40;
      }
LAB_00d0569b:
      ptVar2 = s->code_ptr;
      s->code_ptr = ptVar2 + 1;
      *ptVar2 = 0x89;
      goto LAB_00d056ea;
    }
    opc = 0x57e;
    break;
  case 1:
    if (r < 0x10) {
      uVar5 = 0;
      if (0 < (int)rm) {
        uVar5 = rm;
      }
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (byte)(uVar5 >> 3) & 1 | (byte)(r >> 1) & 4 | 0x48;
      goto LAB_00d0569b;
    }
  case 2:
    uVar5 = 0;
    if (0 < (int)rm) {
      uVar5 = rm;
    }
    opc = 0x5d6;
    break;
  case 3:
    uVar5 = 0;
    if (0 < (int)rm) {
      uVar5 = rm;
    }
    opc = 0x57f;
    break;
  case 4:
    uVar5 = 0;
    if (0 < (int)rm) {
      uVar5 = rm;
    }
    opc = 0xa017f;
  }
  tcg_out_vex_opc(s,opc,r,0,uVar5,in_R9D);
LAB_00d056ea:
  tcg_out_sib_offset(s,r,rm,-1,0,in_R8);
  return;
}

Assistant:

static void temp_allocate_frame(TCGContext *s, TCGTemp *ts)
{
#if !(defined(__sparc__) && TCG_TARGET_REG_BITS == 64)
    /* Sparc64 stack is accessed with offset of 2047 */
    s->current_frame_offset = (s->current_frame_offset +
                               (tcg_target_long)sizeof(tcg_target_long) - 1) &
        ~(sizeof(tcg_target_long) - 1);
#endif
    if (s->current_frame_offset + (tcg_target_long)sizeof(tcg_target_long) >
        s->frame_end) {
        tcg_abort();
    }
    ts->mem_offset = s->current_frame_offset;
    ts->mem_base = s->frame_temp;
    ts->mem_allocated = 1;
    s->current_frame_offset += sizeof(tcg_target_long);
}